

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u8 uVar1;
  u32 uVar2;
  u8 *puVar3;
  u16 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  u8 *puVar13;
  u8 *pAddr_1;
  uint local_88;
  int top;
  int sz;
  int sz2;
  u8 *pAddr;
  u8 *pEnd;
  int iFree2;
  int iFree;
  int iCellStart;
  int iCellLast;
  int iCellFirst;
  uchar *src;
  uchar *temp;
  uchar *data;
  u32 local_38;
  int nCell;
  int cbrk;
  int cellOffset;
  int usableSize;
  int size;
  int hdr;
  int pc;
  int i;
  int nMaxFrag_local;
  MemPage *pPage_local;
  
  puVar3 = pPage->aData;
  uVar5 = (uint)pPage->hdrOffset;
  uVar6 = (uint)pPage->cellOffset;
  uVar7 = (uint)pPage->nCell;
  iVar8 = uVar6 + uVar7 * 2;
  uVar2 = pPage->pBt->usableSize;
  if ((int)(uint)puVar3[(int)(uVar5 + 7)] <= nMaxFrag) {
    uVar9 = (uint)CONCAT11(puVar3[(int)(uVar5 + 1)],puVar3[(long)(int)(uVar5 + 1) + 1]);
    if ((int)(uVar2 - 4) < (int)uVar9) {
      iVar8 = sqlite3CorruptError(0x10fe6);
      return iVar8;
    }
    if (uVar9 != 0) {
      uVar10 = (uint)CONCAT11(puVar3[(int)uVar9],puVar3[(long)(int)uVar9 + 1]);
      if ((int)(uVar2 - 4) < (int)uVar10) {
        iVar8 = sqlite3CorruptError(0x10fe9);
        return iVar8;
      }
      if ((uVar10 == 0) || ((puVar3[(int)uVar10] == '\0' && (puVar3[(int)(uVar10 + 1)] == '\0')))) {
        top = 0;
        local_88 = (uint)CONCAT11(puVar3[(int)(uVar9 + 2)],puVar3[(long)(int)(uVar9 + 2) + 1]);
        uVar11 = (uint)CONCAT11(puVar3[(int)(uVar5 + 5)],puVar3[(long)(int)(uVar5 + 5) + 1]);
        if (uVar9 <= uVar11) {
          iVar8 = sqlite3CorruptError(0x10ff1);
          return iVar8;
        }
        if (uVar10 == 0) {
          if ((int)uVar2 < (int)(uVar9 + local_88)) {
            iVar8 = sqlite3CorruptError(0x10ffa);
            return iVar8;
          }
        }
        else {
          if (uVar10 < uVar9 + local_88) {
            iVar8 = sqlite3CorruptError(0x10ff4);
            return iVar8;
          }
          top = (int)CONCAT11(puVar3[(int)(uVar10 + 2)],puVar3[(long)(int)(uVar10 + 2) + 1]);
          if ((int)uVar2 < (int)(uVar10 + top)) {
            iVar8 = sqlite3CorruptError(0x10ff6);
            return iVar8;
          }
          memmove(puVar3 + (int)(uVar9 + local_88 + top),puVar3 + (int)(uVar9 + local_88),
                  (long)(int)(uVar10 - (uVar9 + local_88)));
          local_88 = top + local_88;
        }
        local_38 = uVar11 + local_88;
        memmove(puVar3 + (int)local_38,puVar3 + (int)uVar11,(long)(int)(uVar9 - uVar11));
        for (_sz = puVar3 + (int)uVar6; _sz < puVar3 + (int)(uVar6 + uVar7 * 2); _sz = _sz + 2) {
          uVar1 = _sz[1];
          uVar11 = (uint)CONCAT11(*_sz,uVar1);
          if (uVar11 < uVar9) {
            *_sz = (u8)(uVar11 + local_88 >> 8);
            _sz[1] = uVar1 + (char)local_88;
          }
          else if (uVar11 < uVar10) {
            *_sz = (u8)(uVar11 + top >> 8);
            _sz[1] = uVar1 + (char)top;
          }
        }
        goto LAB_001fec96;
      }
    }
  }
  uVar9 = (uint)CONCAT11(puVar3[(int)(uVar5 + 5)],puVar3[(long)(int)(uVar5 + 5) + 1]);
  local_38 = uVar2;
  if (uVar7 != 0) {
    pvVar12 = sqlite3PagerTempSpace(pPage->pBt->pPager);
    memcpy((void *)((long)pvVar12 + (long)(int)uVar9),puVar3 + (int)uVar9,(long)(int)(uVar2 - uVar9)
          );
    for (hdr = 0; hdr < (int)uVar7; hdr = hdr + 1) {
      puVar13 = puVar3 + (int)(uVar6 + hdr * 2);
      uVar10 = (uint)CONCAT11(*puVar13,puVar13[1]);
      if ((uVar10 < uVar9) || ((int)(uVar2 - 4) < (int)uVar10)) {
        iVar8 = sqlite3CorruptError(0x1101b);
        return iVar8;
      }
      uVar4 = (*pPage->xCellSize)(pPage,(u8 *)((long)pvVar12 + (long)(int)uVar10));
      uVar11 = (uint)uVar4;
      local_38 = local_38 - uVar11;
      if (((int)local_38 < (int)uVar9) || ((int)uVar2 < (int)(uVar10 + uVar11))) {
        iVar8 = sqlite3CorruptError(0x11021);
        return iVar8;
      }
      *puVar13 = (u8)(local_38 >> 8);
      puVar13[1] = (u8)local_38;
      memcpy(puVar3 + (int)local_38,(void *)((long)pvVar12 + (long)(int)uVar10),(long)(int)uVar11);
    }
  }
  puVar3[(int)(uVar5 + 7)] = '\0';
LAB_001fec96:
  if ((puVar3[(int)(uVar5 + 7)] + local_38) - iVar8 == pPage->nFree) {
    puVar3[(int)(uVar5 + 5)] = (u8)(local_38 >> 8);
    puVar3[(long)(int)(uVar5 + 5) + 1] = (u8)local_38;
    puVar3[(int)(uVar5 + 1)] = '\0';
    puVar3[(int)(uVar5 + 2)] = '\0';
    memset(puVar3 + iVar8,0,(long)(int)(local_38 - iVar8));
    pPage_local._4_4_ = 0;
  }
  else {
    pPage_local._4_4_ = sqlite3CorruptError(0x1102f);
  }
  return pPage_local._4_4_;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  if( nCell>0 ){
    temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
    memcpy(&temp[iCellStart], &data[iCellStart], usableSize - iCellStart);
    src = temp;
    for(i=0; i<nCell; i++){
      u8 *pAddr;     /* The i-th cell pointer */
      pAddr = &data[cellOffset + i*2];
      pc = get2byte(pAddr);
      testcase( pc==iCellFirst );
      testcase( pc==iCellLast );
      /* These conditions have already been verified in btreeInitPage()
      ** if PRAGMA cell_size_check=ON.
      */
      if( pc<iCellStart || pc>iCellLast ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( pc>=iCellStart && pc<=iCellLast );
      size = pPage->xCellSize(pPage, &src[pc]);
      cbrk -= size;
      if( cbrk<iCellStart || pc+size>usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( cbrk+size<=usableSize && cbrk>=iCellStart );
      testcase( cbrk+size==usableSize );
      testcase( pc+size==usableSize );
      put2byte(pAddr, cbrk);
      memcpy(&data[cbrk], &src[pc], size);
    }
  }
  data[hdr+7] = 0;

defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}